

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rng.c
# Opt level: O2

bool_t rngTestFIPS3(octet *buf)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  word s [2] [7];
  
  memSet(s,'\0',0x70);
  bVar5 = (bool)(*buf & 1);
  uVar2 = 6;
  uVar1 = 1;
  uVar4 = uVar1;
  for (uVar3 = uVar1; uVar3 != 20000; uVar3 = uVar3 + 1) {
    if (((buf[uVar3 >> 3] >> ((uint)uVar3 & 7) & 1) != 0) == bVar5) {
      uVar4 = uVar4 + 1;
    }
    else {
      if (5 < uVar4) {
        uVar4 = 6;
      }
      s[bVar5][uVar4 & 0xffffffff] = s[bVar5][uVar4 & 0xffffffff] + 1;
      bVar5 = bVar5 == false;
      uVar4 = uVar1;
    }
  }
  if (uVar4 < 6) {
    uVar2 = (uint)uVar4;
  }
  s[bVar5][uVar2] = s[bVar5][uVar2] + 1;
  return (bool_t)(s[1][6] - 0x67 < 0x6b &&
                 ((s[0][6] - 0x67 < 0x6b &&
                  (s[1][5] - 0x67 < 0x6b && (s[0][5] - 0x67 < 0x6b && s[1][4] - 0xf0 < 0x91))) &&
                 ((s[0][4] - 0xf0 < 0x91 && (s[1][3] - 0x20f < 0xc5 && s[0][3] - 0x20f < 0xc5)) &&
                 ((s[1][2] - 0x45a < 0x111 && s[0][2] - 0x45a < 0x111) &&
                 (s[1][1] - 0x90b < 0x173 && s[0][1] - 0x90b < 0x173)))));
}

Assistant:

bool_t rngTestFIPS3(const octet buf[2500])
{
	word s[2][7];
	octet b;
	size_t l;
	size_t i;
	ASSERT(memIsValid(buf, 2500));
	memSetZero(s, sizeof(s));
	b = buf[0] & 1;
	l = 1;
	for (i = 1; i < 20000; ++i)
		if ((buf[i / 8] >> i % 8 & 1) == b)
			++l;
		else
			++s[b][MIN2(l, 6)], b = !b, l = 1;
	++s[b][MIN2(l, 6)];
	return 2315 <= s[0][1] && s[0][1] <= 2685 &&
		2315 <= s[1][1] && s[1][1] <= 2685 &&
		1114 <= s[0][2] && s[0][2] <= 1386 &&
		1114 <= s[1][2] && s[1][2] <= 1386 &&
		527 <= s[0][3] && s[0][3] <= 723 &&
		527 <= s[1][3] && s[1][3] <= 723 &&
		240 <= s[0][4] && s[0][4] <= 384 &&
		240 <= s[1][4] && s[1][4] <= 384 &&
		103 <= s[0][5] && s[0][5] <= 209 &&
		103 <= s[1][5] && s[1][5] <= 209 &&
		103 <= s[0][6] && s[0][6] <= 209 &&
		103 <= s[1][6] && s[1][6] <= 209;
}